

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseCommentComplex(xmlParserCtxtPtr ctxt,xmlChar *buf,size_t len,size_t size)

{
  xmlParserInputPtr pxVar1;
  commentSAXFunc p_Var2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  xmlChar *pxVar8;
  xmlParserErrors xVar9;
  int rl;
  int l;
  int ql;
  uint int1;
  uint int1_00;
  char *pcVar10;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 uVar11;
  xmlChar *pxVar12;
  xmlChar *local_58;
  size_t local_50;
  int local_48;
  uint local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  
  local_44 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    local_44 = 10000000;
  }
  local_58 = buf;
  local_50 = len;
  if (buf == (xmlChar *)0x0) {
    size = 100;
    local_58 = (xmlChar *)(*xmlMalloc)(100);
    if (local_58 == (xmlChar *)0x0) {
      xmlCtxtErrMemory(ctxt);
      return;
    }
    local_50 = 0;
  }
  uVar4 = xmlCurrentChar(ctxt,&local_3c);
  int1 = 0xfffd;
  if (uVar4 != 0x200000) {
    int1 = uVar4;
  }
  if (int1 == 0) {
LAB_0013639d:
    pcVar10 = "Comment not terminated\n";
    uVar11 = 0;
    int1 = 0;
    xVar9 = XML_ERR_COMMENT_NOT_FINISHED;
  }
  else {
    if (0xff < (int)int1) {
      if ((0xfffff < int1 - 0x10000 && 0x1ffd < int1 - 0xe000) && 0xd7ff < (int)int1)
      goto LAB_00136077;
LAB_0013602c:
      pxVar1 = ctxt->input;
      if (*pxVar1->cur == '\n') {
        pxVar1->line = pxVar1->line + 1;
        pxVar1->col = 1;
      }
      else {
        pxVar1->col = pxVar1->col + 1;
      }
      pxVar1->cur = pxVar1->cur + local_3c;
      uVar5 = xmlCurrentChar(ctxt,&local_48);
      uVar4 = 0xfffd;
      if (uVar5 != 0x200000) {
        uVar4 = uVar5;
      }
      if (uVar4 != 0) {
        if ((int)uVar4 < 0x100) {
          if (((int)uVar4 < 0x20) && ((0xd < uVar4 || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0)))) {
LAB_00136141:
            uVar11 = CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),uVar4);
            int1 = uVar4;
            goto LAB_00136155;
          }
        }
        else if ((0xfffff < uVar4 - 0x10000 && 0x1ffd < uVar4 - 0xe000) && 0xd7ff < (int)uVar4)
        goto LAB_00136141;
        pxVar1 = ctxt->input;
        if (*pxVar1->cur == '\n') {
          pxVar1->line = pxVar1->line + 1;
          pxVar1->col = 1;
        }
        else {
          pxVar1->col = pxVar1->col + 1;
        }
        pxVar1->cur = pxVar1->cur + local_48;
        uVar5 = xmlCurrentChar(ctxt,&local_40);
        if (uVar5 == 0x200000) {
          uVar5 = 0xfffd;
        }
        if (uVar5 != 0) {
          while (int1_00 = uVar5, 0xff < (int)int1_00) {
            if ((0xfffff < int1_00 - 0x10000 && 0x1ffd < int1_00 - 0xe000) && 0xd7ff < (int)int1_00)
            goto LAB_001363fd;
LAB_001361fc:
            if (((int1 == 0x2d) && (uVar4 == 0x2d)) && (int1_00 == 0x3e)) goto LAB_001363fd;
            if (int1 == 0x2d && uVar4 == 0x2d) {
              xmlFatalErr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,(char *)0x0);
            }
            if (size <= local_50 + 5) {
              iVar7 = (int)size;
              if (iVar7 < 1) {
                uVar5 = 1;
              }
              else {
                uVar5 = 0xffffffff;
                if ((iVar7 < (int)local_44) &&
                   (uVar6 = iVar7 + 1U >> 1, uVar5 = uVar6 + iVar7, (int)(local_44 - uVar6) < iVar7)
                   ) {
                  uVar5 = local_44;
                }
              }
              if ((int)uVar5 < 0) {
                in_stack_ffffffffffffff98 = 0;
                xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_COMMENT_NOT_FINISHED,
                           XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,
                           "Comment too big found",0);
LAB_001362ed:
                (*xmlFree)(local_58);
                bVar3 = false;
              }
              else {
                local_38 = size;
                pxVar8 = (xmlChar *)(*xmlRealloc)(local_58,(ulong)uVar5);
                if (pxVar8 == (xmlChar *)0x0) {
                  xmlCtxtErrMemory(ctxt);
                  size = local_38;
                  goto LAB_001362ed;
                }
                bVar3 = true;
                size = (ulong)uVar5;
                local_58 = pxVar8;
              }
              if (!bVar3) {
                return;
              }
            }
            if ((int)int1 < 0x80) {
              local_58[local_50] = (xmlChar)int1;
              local_50 = local_50 + 1;
            }
            else {
              iVar7 = xmlCopyCharMultiByte(local_58 + local_50,int1);
              local_50 = local_50 + (long)iVar7;
            }
            local_3c = local_48;
            local_48 = local_40;
            pxVar1 = ctxt->input;
            if (*pxVar1->cur == '\n') {
              pxVar1->line = pxVar1->line + 1;
              pxVar1->col = 1;
            }
            else {
              pxVar1->col = pxVar1->col + 1;
            }
            pxVar1->cur = pxVar1->cur + local_40;
            uVar5 = xmlCurrentChar(ctxt,&local_40);
            int1 = uVar4;
            uVar4 = int1_00;
            if (uVar5 == 0x200000) {
              uVar5 = 0xfffd;
            }
          }
          if ((0x1f < (int)int1_00) || ((int1_00 < 0xe && ((0x2600U >> (int1_00 & 0x1f) & 1) != 0)))
             ) goto LAB_001361fc;
LAB_001363fd:
          local_58[local_50] = '\0';
          if (int1_00 == 0) {
            pcVar10 = "Comment not terminated \n<!--%.50s\n";
            int1_00 = 0;
            xVar9 = XML_ERR_COMMENT_NOT_FINISHED;
            pxVar8 = local_58;
            pxVar12 = local_58;
LAB_0013651b:
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,xVar9,XML_ERR_FATAL,pxVar8,
                       (xmlChar *)0x0,(xmlChar *)0x0,int1_00,pcVar10,pxVar12);
          }
          else {
            if ((int)int1_00 < 0x100) {
              if (((int)int1_00 < 0x20) &&
                 ((0xd < int1_00 || ((0x2600U >> (int1_00 & 0x1f) & 1) == 0)))) {
LAB_001364e8:
                pcVar10 = "xmlParseComment: invalid xmlChar value %d\n";
                xVar9 = XML_ERR_INVALID_CHAR;
                pxVar8 = (xmlChar *)0x0;
                pxVar12 = (xmlChar *)
                          CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),int1_00);
                goto LAB_0013651b;
              }
            }
            else if ((0xfffff < int1_00 - 0x10000 && 0x1ffd < int1_00 - 0xe000) &&
                     0xd7ff < (int)int1_00) goto LAB_001364e8;
            xmlNextChar(ctxt);
            if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                (p_Var2 = ctxt->sax->comment, p_Var2 != (commentSAXFunc)0x0)) &&
               (ctxt->disableSAX == 0)) {
              (*p_Var2)(ctxt->userData,local_58);
            }
          }
          goto LAB_001363ec;
        }
      }
      goto LAB_0013639d;
    }
    if ((0x1f < (int)int1) || ((int1 < 0xe && ((0x2600U >> (int1 & 0x1f) & 1) != 0))))
    goto LAB_0013602c;
LAB_00136077:
    uVar11 = CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),int1);
LAB_00136155:
    pcVar10 = "xmlParseComment: invalid xmlChar value %d\n";
    xVar9 = XML_ERR_INVALID_CHAR;
  }
  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,xVar9,XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0,
             (xmlChar *)0x0,int1,pcVar10,uVar11);
LAB_001363ec:
  (*xmlFree)(local_58);
  return;
}

Assistant:

static void
xmlParseCommentComplex(xmlParserCtxtPtr ctxt, xmlChar *buf,
                       size_t len, size_t size) {
    int q, ql;
    int r, rl;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_HUGE_LENGTH :
                    XML_MAX_TEXT_LENGTH;

    if (buf == NULL) {
        len = 0;
	size = XML_PARSER_BUFFER_SIZE;
	buf = xmlMalloc(size);
	if (buf == NULL) {
	    xmlErrMemory(ctxt);
	    return;
	}
    }
    q = xmlCurrentCharRecover(ctxt, &ql);
    if (q == 0)
        goto not_terminated;
    if (!IS_CHAR(q)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  q);
	xmlFree (buf);
	return;
    }
    NEXTL(ql);
    r = xmlCurrentCharRecover(ctxt, &rl);
    if (r == 0)
        goto not_terminated;
    if (!IS_CHAR(r)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  r);
	xmlFree (buf);
	return;
    }
    NEXTL(rl);
    cur = xmlCurrentCharRecover(ctxt, &l);
    if (cur == 0)
        goto not_terminated;
    while (IS_CHAR(cur) && /* checked */
           ((cur != '>') ||
	    (r != '-') || (q != '-'))) {
	if ((r == '-') && (q == '-')) {
	    xmlFatalErr(ctxt, XML_ERR_HYPHEN_IN_COMMENT, NULL);
	}
	if (len + 5 >= size) {
	    xmlChar *tmp;
            int newSize;

	    newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize < 0) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                             "Comment too big found", NULL);
                xmlFree (buf);
                return;
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt);
		xmlFree(buf);
		return;
	    }
	    buf = tmp;
            size = newSize;
	}
	COPY_BUF(buf, len, q);

	q = r;
	ql = rl;
	r = cur;
	rl = l;

	NEXTL(l);
	cur = xmlCurrentCharRecover(ctxt, &l);

    }
    buf[len] = 0;
    if (cur == 0) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
	                     "Comment not terminated \n<!--%.50s\n", buf);
    } else if (!IS_CHAR(cur)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  cur);
    } else {
        NEXT;
	if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->comment(ctxt->userData, buf);
    }
    xmlFree(buf);
    return;
not_terminated:
    xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
			 "Comment not terminated\n", NULL);
    xmlFree(buf);
}